

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableObjectWalker::RecyclableObjectWalker
          (RecyclableObjectWalker *this,ScriptContext *_scriptContext,Var _slot)

{
  (this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
       (_func_int **)&PTR_Get_0137ef18;
  this->scriptContext = _scriptContext;
  this->instance = _slot;
  this->originalInstance = _slot;
  this->pMembersList =
       (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  this->innerArrayObjectWalker = (RecyclableArrayWalker *)0x0;
  this->fakeGroupObjectWalkerList =
       (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  return;
}

Assistant:

RecyclableObjectWalker::RecyclableObjectWalker(ScriptContext* _scriptContext, Var _slot)
        : scriptContext(_scriptContext),
        instance(_slot),
        originalInstance(_slot),
        pMembersList(nullptr),
        innerArrayObjectWalker(nullptr),
        fakeGroupObjectWalkerList(nullptr)
    {
    }